

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void embree::SceneGraph::convert_mblur_to_nonmblur(Ref<embree::SceneGraph::Node> *node)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Node *pNVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  undefined8 uVar7;
  long *plVar8;
  long lVar9;
  void *pvVar10;
  long lVar11;
  size_t i;
  ulong uVar12;
  ulong uVar13;
  size_t i_1;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar3 = node->ptr;
  if (pNVar3 != (Node *)0x0) {
    plVar8 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&TransformNode::typeinfo);
    if (plVar8 == (long *)0x0) {
      plVar8 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
      if (plVar8 == (long *)0x0) {
        plVar8 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&GroupNode::typeinfo,0);
        if (plVar8 == (long *)0x0) {
          plVar8 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
          if (plVar8 == (long *)0x0) {
            plVar8 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
            if (plVar8 == (long *)0x0) {
              plVar8 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&HairSetNode::typeinfo,0);
              if (plVar8 == (long *)0x0) {
                plVar8 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&PointSetNode::typeinfo,0);
                if (plVar8 == (long *)0x0) {
                  plVar8 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&SubdivMeshNode::typeinfo,0
                                                 );
                  if (plVar8 == (long *)0x0) {
                    plVar8 = (long *)__dynamic_cast(pNVar3,&Node::typeinfo,&GridMeshNode::typeinfo,0
                                                   );
                    if (plVar8 != (long *)0x0) {
                      (**(code **)(*plVar8 + 0x10))(plVar8);
                      std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(plVar8 + 0xe),1);
                      (**(code **)(*plVar8 + 0x18))(plVar8);
                    }
                  }
                  else {
                    (**(code **)(*plVar8 + 0x10))(plVar8);
                    if (plVar8[0xf] != plVar8[0xe]) {
                      std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(plVar8 + 0xe),1);
                    }
                    if (plVar8[0x12] != plVar8[0x11]) {
                      std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(plVar8 + 0x11),1);
                    }
                    (**(code **)(*plVar8 + 0x18))(plVar8);
                  }
                }
                else {
                  (**(code **)(*plVar8 + 0x10))(plVar8);
                  if (plVar8[0x10] != plVar8[0xf]) {
                    std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                              *)(plVar8 + 0xf),1);
                  }
                  if (plVar8[0x13] != plVar8[0x12]) {
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(plVar8 + 0x12),1);
                  }
                  (**(code **)(*plVar8 + 0x18))(plVar8);
                }
              }
              else {
                (**(code **)(*plVar8 + 0x10))(plVar8);
                if (plVar8[0x10] != plVar8[0xf]) {
                  std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)(plVar8 + 0xf),1);
                }
                if (plVar8[0x13] != plVar8[0x12]) {
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            *)(plVar8 + 0x12),1);
                }
                if (plVar8[0x16] != plVar8[0x15]) {
                  std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)(plVar8 + 0x15),1);
                }
                if (plVar8[0x19] != plVar8[0x18]) {
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            *)(plVar8 + 0x18),1);
                }
                (**(code **)(*plVar8 + 0x18))(plVar8);
              }
            }
            else {
              (**(code **)(*plVar8 + 0x10))(plVar8);
              if (plVar8[0xf] != plVar8[0xe]) {
                std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          *)(plVar8 + 0xe),1);
              }
              if (plVar8[0x12] != plVar8[0x11]) {
                std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          *)(plVar8 + 0x11),1);
              }
              (**(code **)(*plVar8 + 0x18))(plVar8);
            }
          }
          else {
            (**(code **)(*plVar8 + 0x10))(plVar8);
            if (plVar8[0xf] != plVar8[0xe]) {
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        *)(plVar8 + 0xe),1);
            }
            if (plVar8[0x12] != plVar8[0x11]) {
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        *)(plVar8 + 0x11),1);
            }
            (**(code **)(*plVar8 + 0x18))(plVar8);
          }
        }
        else {
          (**(code **)(*plVar8 + 0x10))(plVar8);
          uVar13 = 0;
          while( true ) {
            if ((ulong)(plVar8[0xe] - plVar8[0xd] >> 3) <= uVar13) break;
            pNVar3 = *(Node **)(plVar8[0xd] + uVar13 * 8);
            local_48.ptr = pNVar3;
            if (pNVar3 != (Node *)0x0) {
              (*(pNVar3->super_RefCount)._vptr_RefCount[2])(pNVar3);
            }
            convert_mblur_to_nonmblur(&local_48);
            if (pNVar3 != (Node *)0x0) {
              (*(pNVar3->super_RefCount)._vptr_RefCount[3])(pNVar3);
            }
            uVar13 = uVar13 + 1;
          }
          (**(code **)(*plVar8 + 0x18))(plVar8);
        }
      }
      else {
        (**(code **)(*plVar8 + 0x10))(plVar8);
        uVar13 = 0;
        while( true ) {
          if ((ulong)((plVar8[0xe] - plVar8[0xd]) / 0x30) <= uVar13) break;
          lVar4 = plVar8[0xd] + uVar13 * 0x30;
          lVar11 = *(long *)(lVar4 + 0x18);
          if (1 < *(ulong *)(lVar4 + 0x10)) {
            *(undefined8 *)(lVar4 + 0x10) = 1;
          }
          if (lVar11 == 0) {
            pvVar6 = *(void **)(lVar4 + 0x20);
            pvVar10 = alignedMalloc(0x40,0x10);
            *(void **)(lVar4 + 0x20) = pvVar10;
            lVar9 = 0x30;
            for (uVar12 = 0; uVar12 < *(ulong *)(lVar4 + 0x10); uVar12 = uVar12 + 1) {
              lVar5 = *(long *)(lVar4 + 0x20);
              puVar1 = (undefined8 *)((long)pvVar6 + lVar9 + -0x30);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)(lVar5 + -0x30 + lVar9);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              puVar1 = (undefined8 *)((long)pvVar6 + lVar9 + -0x20);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)(lVar5 + -0x20 + lVar9);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              puVar1 = (undefined8 *)((long)pvVar6 + lVar9 + -0x10);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)(lVar5 + -0x10 + lVar9);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              uVar7 = ((undefined8 *)((long)pvVar6 + lVar9))[1];
              *(undefined8 *)(lVar5 + lVar9) = *(undefined8 *)((long)pvVar6 + lVar9);
              ((undefined8 *)(lVar5 + lVar9))[1] = uVar7;
              lVar9 = lVar9 + 0x40;
            }
            alignedFree(pvVar6);
            *(undefined8 *)(lVar4 + 0x10) = 1;
            *(ulong *)(lVar4 + 0x18) = lVar11 + (ulong)(lVar11 == 0);
          }
          else {
            *(undefined8 *)(lVar4 + 0x10) = 1;
          }
          uVar13 = uVar13 + 1;
        }
        pNVar3 = (Node *)plVar8[0x10];
        local_40.ptr = pNVar3;
        if (pNVar3 != (Node *)0x0) {
          (*(pNVar3->super_RefCount)._vptr_RefCount[2])(pNVar3);
        }
        convert_mblur_to_nonmblur(&local_40);
        if (pNVar3 != (Node *)0x0) {
          (*(pNVar3->super_RefCount)._vptr_RefCount[3])(pNVar3);
        }
        (**(code **)(*plVar8 + 0x18))(plVar8);
      }
    }
    else {
      (**(code **)(*plVar8 + 0x10))(plVar8);
      lVar4 = plVar8[0x10];
      if (1 < (ulong)plVar8[0xf]) {
        plVar8[0xf] = 1;
      }
      if (lVar4 == 0) {
        pvVar6 = (void *)plVar8[0x11];
        pvVar10 = alignedMalloc(0x40,0x10);
        plVar8[0x11] = (long)pvVar10;
        lVar11 = 0x30;
        for (uVar13 = 0; uVar13 < (ulong)plVar8[0xf]; uVar13 = uVar13 + 1) {
          lVar9 = plVar8[0x11];
          puVar1 = (undefined8 *)((long)pvVar6 + lVar11 + -0x30);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)(lVar9 + -0x30 + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          puVar1 = (undefined8 *)((long)pvVar6 + lVar11 + -0x20);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)(lVar9 + -0x20 + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          puVar1 = (undefined8 *)((long)pvVar6 + lVar11 + -0x10);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)(lVar9 + -0x10 + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          uVar7 = ((undefined8 *)((long)pvVar6 + lVar11))[1];
          *(undefined8 *)(lVar9 + lVar11) = *(undefined8 *)((long)pvVar6 + lVar11);
          ((undefined8 *)(lVar9 + lVar11))[1] = uVar7;
          lVar11 = lVar11 + 0x40;
        }
        alignedFree(pvVar6);
        plVar8[0xf] = 1;
        plVar8[0x10] = lVar4 + (ulong)(lVar4 == 0);
      }
      else {
        plVar8[0xf] = 1;
      }
      pNVar3 = (Node *)plVar8[0x13];
      local_38.ptr = pNVar3;
      if (pNVar3 != (Node *)0x0) {
        (*(pNVar3->super_RefCount)._vptr_RefCount[2])(pNVar3);
      }
      convert_mblur_to_nonmblur(&local_38);
      if (pNVar3 != (Node *)0x0) {
        (*(pNVar3->super_RefCount)._vptr_RefCount[3])(pNVar3);
      }
      (**(code **)(*plVar8 + 0x18))(plVar8);
    }
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::print(std::ostream& cout, int depth) {
    cout << "HairSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }